

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_cipher_setup(psa_cipher_operation_t *operation,psa_key_handle_t handle,psa_algorithm_t alg,
                mbedtls_operation_t cipher_operation)

{
  size_t key_bits_00;
  mbedtls_cipher_info_t *cipher_info_00;
  uint8_t local_78;
  uint8_t local_74;
  uint8_t local_70;
  undefined8 local_68;
  uint8_t keys [24];
  psa_key_usage_t usage;
  mbedtls_cipher_info_t *cipher_info;
  size_t key_bits;
  psa_key_slot_t *slot;
  int local_28;
  psa_status_t status;
  int ret;
  mbedtls_operation_t cipher_operation_local;
  psa_algorithm_t alg_local;
  psa_key_handle_t handle_local;
  psa_cipher_operation_t *operation_local;
  
  local_28 = 0;
  slot._4_4_ = 0xffffff7c;
  keys[0x14] = '\0';
  keys[0x15] = '\x02';
  keys[0x16] = '\0';
  keys[0x17] = '\0';
  if (cipher_operation == MBEDTLS_ENCRYPT) {
    keys[0x14] = '\0';
    keys[0x15] = '\x01';
    keys[0x16] = '\0';
    keys[0x17] = '\0';
  }
  if (operation->alg == 0) {
    status = cipher_operation;
    ret = alg;
    cipher_operation_local._2_2_ = handle;
    _alg_local = operation;
    slot._4_4_ = psa_cipher_init(operation,alg);
    operation_local._4_4_ = slot._4_4_;
    if (slot._4_4_ == 0) {
      slot._4_4_ = psa_get_key_from_slot
                             (cipher_operation_local._2_2_,(psa_key_slot_t **)&key_bits,keys._20_4_,
                              ret);
      if (slot._4_4_ == 0) {
        key_bits_00 = psa_get_key_slot_bits((psa_key_slot_t *)key_bits);
        cipher_info_00 =
             mbedtls_cipher_info_from_psa
                       (ret,*(psa_key_type_t *)key_bits,key_bits_00,(mbedtls_cipher_id_t *)0x0);
        if (cipher_info_00 == (mbedtls_cipher_info_t *)0x0) {
          slot._4_4_ = -0x86;
        }
        else {
          local_28 = mbedtls_cipher_setup(&(_alg_local->ctx).cipher,cipher_info_00);
          if (local_28 == 0) {
            if ((*(short *)key_bits == 0x2301) && (key_bits_00 == 0x80)) {
              local_68 = **(undefined8 **)(key_bits + 0x20);
              keys._0_8_ = (*(undefined8 **)(key_bits + 0x20))[1];
              keys._8_8_ = *(undefined8 *)*(uint8_t **)(key_bits + 0x20);
              local_28 = mbedtls_cipher_setkey
                                   (&(_alg_local->ctx).cipher,(uchar *)&local_68,0xc0,status);
            }
            else {
              local_28 = mbedtls_cipher_setkey
                                   (&(_alg_local->ctx).cipher,*(uchar **)(key_bits + 0x20),
                                    (int)key_bits_00,status);
            }
            if (local_28 == 0) {
              if (ret == 0x4600100) {
                local_28 = mbedtls_cipher_set_padding_mode
                                     (&(_alg_local->ctx).cipher,MBEDTLS_PADDING_NONE);
              }
              else if (ret == 0x4600101) {
                local_28 = mbedtls_cipher_set_padding_mode
                                     (&(_alg_local->ctx).cipher,MBEDTLS_PADDING_PKCS7);
              }
              else {
                local_28 = 0;
              }
              if (local_28 == 0) {
                _alg_local->field_0x4 = _alg_local->field_0x4 & 0xfe | 1;
                if ((ret & 0x7f800000U) == 0x4800000) {
                  local_70 = '\x01';
                }
                else {
                  if ((*(ushort *)key_bits & 0x7000) == 0x2000) {
                    local_74 = (uint8_t)(1 << ((byte)((ushort)*(undefined2 *)key_bits >> 8) & 7));
                  }
                  else {
                    local_74 = '\0';
                  }
                  local_70 = local_74;
                }
                _alg_local->block_size = local_70;
                if ((ret & 0x400000U) == 0) {
                  if (ret == 0x4800005) {
                    _alg_local->iv_size = '\f';
                  }
                }
                else {
                  if ((*(ushort *)key_bits & 0x7000) == 0x2000) {
                    local_78 = (uint8_t)(1 << ((byte)((ushort)*(undefined2 *)key_bits >> 8) & 7));
                  }
                  else {
                    local_78 = '\0';
                  }
                  _alg_local->iv_size = local_78;
                }
              }
            }
          }
        }
      }
      if (slot._4_4_ == 0) {
        slot._4_4_ = mbedtls_to_psa_error(local_28);
      }
      if (slot._4_4_ != 0) {
        psa_cipher_abort(_alg_local);
      }
      operation_local._4_4_ = slot._4_4_;
    }
  }
  else {
    operation_local._4_4_ = -0x89;
  }
  return operation_local._4_4_;
}

Assistant:

static psa_status_t psa_cipher_setup( psa_cipher_operation_t *operation,
                                      psa_key_handle_t handle,
                                      psa_algorithm_t alg,
                                      mbedtls_operation_t cipher_operation )
{
    int ret = 0;
    psa_status_t status = PSA_ERROR_GENERIC_ERROR;
    psa_key_slot_t *slot;
    size_t key_bits;
    const mbedtls_cipher_info_t *cipher_info = NULL;
    psa_key_usage_t usage = ( cipher_operation == MBEDTLS_ENCRYPT ?
                              PSA_KEY_USAGE_ENCRYPT :
                              PSA_KEY_USAGE_DECRYPT );

    /* A context must be freshly initialized before it can be set up. */
    if( operation->alg != 0 )
    {
        return( PSA_ERROR_BAD_STATE );
    }

    status = psa_cipher_init( operation, alg );
    if( status != PSA_SUCCESS )
        return( status );

    status = psa_get_transparent_key( handle, &slot, usage, alg);
    if( status != PSA_SUCCESS )
        goto exit;
    key_bits = psa_get_key_slot_bits( slot );

    cipher_info = mbedtls_cipher_info_from_psa( alg, slot->attr.type, key_bits, NULL );
    if( cipher_info == NULL )
    {
        status = PSA_ERROR_NOT_SUPPORTED;
        goto exit;
    }

    ret = mbedtls_cipher_setup( &operation->ctx.cipher, cipher_info );
    if( ret != 0 )
        goto exit;

#if defined(MBEDTLS_DES_C)
    if( slot->attr.type == PSA_KEY_TYPE_DES && key_bits == 128 )
    {
        /* Two-key Triple-DES is 3-key Triple-DES with K1=K3 */
        uint8_t keys[24];
        memcpy( keys, slot->data.raw.data, 16 );
        memcpy( keys + 16, slot->data.raw.data, 8 );
        ret = mbedtls_cipher_setkey( &operation->ctx.cipher,
                                     keys,
                                     192, cipher_operation );
    }
    else
#endif
    {
        ret = mbedtls_cipher_setkey( &operation->ctx.cipher,
                                     slot->data.raw.data,
                                     (int) key_bits, cipher_operation );
    }
    if( ret != 0 )
        goto exit;

#if defined(MBEDTLS_CIPHER_MODE_WITH_PADDING)
    switch( alg )
    {
        case PSA_ALG_CBC_NO_PADDING:
            ret = mbedtls_cipher_set_padding_mode( &operation->ctx.cipher,
                                                   MBEDTLS_PADDING_NONE );
            break;
        case PSA_ALG_CBC_PKCS7:
            ret = mbedtls_cipher_set_padding_mode( &operation->ctx.cipher,
                                                   MBEDTLS_PADDING_PKCS7 );
            break;
        default:
            /* The algorithm doesn't involve padding. */
            ret = 0;
            break;
    }
    if( ret != 0 )
        goto exit;
#endif //MBEDTLS_CIPHER_MODE_WITH_PADDING

    operation->key_set = 1;
    operation->block_size = ( PSA_ALG_IS_STREAM_CIPHER( alg ) ? 1 :
                              PSA_BLOCK_CIPHER_BLOCK_SIZE( slot->attr.type ) );
    if( alg & PSA_ALG_CIPHER_FROM_BLOCK_FLAG )
    {
        operation->iv_size = PSA_BLOCK_CIPHER_BLOCK_SIZE( slot->attr.type );
    }
#if defined(MBEDTLS_CHACHA20_C)
    else
    if( alg == PSA_ALG_CHACHA20 )
        operation->iv_size = 12;
#endif

exit:
    if( status == 0 )
        status = mbedtls_to_psa_error( ret );
    if( status != 0 )
        psa_cipher_abort( operation );
    return( status );
}